

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_relation.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::QueryRelation::GetTableRef(QueryRelation *this)

{
  pointer pSVar1;
  SubqueryRef *this_00;
  pointer *__ptr;
  long *in_RSI;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  string local_40;
  
  pSVar1 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)(in_RSI + 0xd));
  (*(pSVar1->super_SQLStatement)._vptr_SQLStatement[3])(&local_40,pSVar1);
  (**(code **)(*in_RSI + 0x28))(&local_60);
  this_00 = (SubqueryRef *)operator_new(0x70);
  local_68._M_head_impl = (SelectStatement *)local_40._M_dataplus._M_p;
  if (local_60 == &local_50) {
    local_40.field_2._8_8_ = local_50._8_8_;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  }
  else {
    local_40._M_dataplus._M_p = (pointer)local_60;
  }
  local_40._M_string_length = local_58;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_60 = &local_50;
  SubqueryRef::SubqueryRef
            (this_00,(unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                      *)&local_68,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_68._M_head_impl != (SelectStatement *)0x0) {
    (*((local_68._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  (this->super_Relation)._vptr_Relation = (_func_int **)this_00;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> QueryRelation::GetTableRef() {
	auto subquery_ref = make_uniq<SubqueryRef>(GetSelectStatement(), GetAlias());
	return std::move(subquery_ref);
}